

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntrusiveList.h
# Opt level: O0

uint __thiscall IntrusiveList<SynBase>::size(IntrusiveList<SynBase> *this)

{
  SynBase *local_20;
  SynBase *curr;
  uint count;
  IntrusiveList<SynBase> *this_local;
  
  curr._4_4_ = 0;
  for (local_20 = this->head; local_20 != (SynBase *)0x0; local_20 = local_20->next) {
    curr._4_4_ = curr._4_4_ + 1;
  }
  return curr._4_4_;
}

Assistant:

unsigned size() const
	{
		unsigned count = 0;

		T *curr = head;

		while(curr)
		{
			count++;

			curr = static_cast<T*>(curr->next);
		}

		return count;
	}